

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c.h
# Opt level: O1

SweeperLite * Sweeper_sweeperlite(SweeperLite *__return_storage_ptr__,Sweeper *sweeper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  __return_storage_ptr__->vilocal_host_ = sweeper->vilocal_host_;
  __return_storage_ptr__->vslocal_host_ = sweeper->vslocal_host_;
  __return_storage_ptr__->volocal_host_ = sweeper->volocal_host_;
  iVar1 = (sweeper->dims).na;
  (__return_storage_ptr__->dims).nm = (sweeper->dims).nm;
  (__return_storage_ptr__->dims).na = iVar1;
  iVar1 = (sweeper->dims).ncell_y;
  iVar2 = (sweeper->dims).ncell_z;
  iVar3 = (sweeper->dims).ne;
  (__return_storage_ptr__->dims).ncell_x = (sweeper->dims).ncell_x;
  (__return_storage_ptr__->dims).ncell_y = iVar1;
  (__return_storage_ptr__->dims).ncell_z = iVar2;
  (__return_storage_ptr__->dims).ne = iVar3;
  iVar1 = (sweeper->dims_b).na;
  (__return_storage_ptr__->dims_b).nm = (sweeper->dims_b).nm;
  (__return_storage_ptr__->dims_b).na = iVar1;
  iVar1 = (sweeper->dims_b).ncell_y;
  iVar2 = (sweeper->dims_b).ncell_z;
  iVar3 = (sweeper->dims_b).ne;
  (__return_storage_ptr__->dims_b).ncell_x = (sweeper->dims_b).ncell_x;
  (__return_storage_ptr__->dims_b).ncell_y = iVar1;
  (__return_storage_ptr__->dims_b).ncell_z = iVar2;
  (__return_storage_ptr__->dims_b).ne = iVar3;
  iVar1 = (sweeper->dims_g).ncell_y;
  iVar2 = (sweeper->dims_g).ncell_z;
  iVar3 = (sweeper->dims_g).ne;
  (__return_storage_ptr__->dims_g).ncell_x = (sweeper->dims_g).ncell_x;
  (__return_storage_ptr__->dims_g).ncell_y = iVar1;
  (__return_storage_ptr__->dims_g).ncell_z = iVar2;
  (__return_storage_ptr__->dims_g).ne = iVar3;
  iVar1 = (sweeper->dims_g).na;
  (__return_storage_ptr__->dims_g).nm = (sweeper->dims_g).nm;
  (__return_storage_ptr__->dims_g).na = iVar1;
  __return_storage_ptr__->nthread_e = sweeper->nthread_e;
  __return_storage_ptr__->nthread_octant = sweeper->nthread_octant;
  __return_storage_ptr__->nthread_x = sweeper->nthread_x;
  __return_storage_ptr__->nthread_y = sweeper->nthread_y;
  __return_storage_ptr__->nthread_z = sweeper->nthread_z;
  __return_storage_ptr__->nblock_z = sweeper->nblock_z;
  __return_storage_ptr__->nblock_octant = sweeper->nblock_octant;
  __return_storage_ptr__->noctant_per_block = sweeper->noctant_per_block;
  __return_storage_ptr__->nsemiblock = sweeper->nsemiblock;
  __return_storage_ptr__->ncell_x_per_subblock = sweeper->ncell_x_per_subblock;
  __return_storage_ptr__->ncell_y_per_subblock = sweeper->ncell_y_per_subblock;
  __return_storage_ptr__->ncell_z_per_subblock = sweeper->ncell_z_per_subblock;
  return __return_storage_ptr__;
}

Assistant:

SweeperLite Sweeper_sweeperlite( Sweeper* sweeper )
{
  SweeperLite sweeperlite;

  sweeperlite.vilocal_host_ = sweeper->vilocal_host_;
  sweeperlite.vslocal_host_ = sweeper->vslocal_host_;
  sweeperlite.volocal_host_ = sweeper->volocal_host_;

  sweeperlite.dims   = sweeper->dims;
  sweeperlite.dims_b = sweeper->dims_b;
  sweeperlite.dims_g = sweeper->dims_g;

  sweeperlite.nthread_e      = sweeper->nthread_e;
  sweeperlite.nthread_octant = sweeper->nthread_octant;
  sweeperlite.nthread_x      = sweeper->nthread_x;
  sweeperlite.nthread_y      = sweeper->nthread_y;
  sweeperlite.nthread_z      = sweeper->nthread_z;

  sweeperlite.nblock_z             = sweeper->nblock_z;
  sweeperlite.nblock_octant        = sweeper->nblock_octant;
  sweeperlite.noctant_per_block    = sweeper->noctant_per_block;
  sweeperlite.nsemiblock           = sweeper->nsemiblock;
  sweeperlite.ncell_x_per_subblock = sweeper->ncell_x_per_subblock;
  sweeperlite.ncell_y_per_subblock = sweeper->ncell_y_per_subblock;
  sweeperlite.ncell_z_per_subblock = sweeper->ncell_z_per_subblock;

#ifdef USE_OPENMP_TASKS
  /*---Mark these as not yet properly initialized---*/
  sweeperlite.thread_e = -1;
  sweeperlite.thread_octant = -1;
  sweeperlite.thread_x = -1;
  sweeperlite.thread_y = -1;
  sweeperlite.thread_z = -1;
  /*---(Arbitrarily) point to the base of the current sweeper struct---*/
  /*---NOTE: will break if sweeperlite is used after sweeper destroyed---*/
  sweeperlite.task_dependency = (char*)sweeper;
#endif

  return sweeperlite;
}